

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

uint16_t __thiscall helics::CommonCore::getNextAirlockIndex(CommonCore *this)

{
  atomic<unsigned_short> *paVar1;
  uint16_t exp;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  bool bVar5;
  
  LOCK();
  paVar1 = &this->nextAirLock;
  uVar4 = (paVar1->super___atomic_base<unsigned_short>)._M_i;
  (paVar1->super___atomic_base<unsigned_short>)._M_i =
       (paVar1->super___atomic_base<unsigned_short>)._M_i + 1;
  UNLOCK();
  uVar4 = uVar4 & 3;
  if (uVar4 == 3) {
    uVar2 = 4;
    do {
      LOCK();
      uVar3 = (this->nextAirLock).super___atomic_base<unsigned_short>._M_i;
      bVar5 = uVar2 == uVar3;
      if (bVar5) {
        (this->nextAirLock).super___atomic_base<unsigned_short>._M_i = uVar2 & 3;
        uVar3 = uVar2;
      }
      UNLOCK();
    } while ((!bVar5) && (uVar2 = uVar3, 3 < uVar3));
  }
  return uVar4;
}

Assistant:

uint16_t CommonCore::getNextAirlockIndex()
{
    uint16_t index = nextAirLock++;
    if (index > 3) {  // the increment is an atomic operation if the nextAirLock was not adjusted
                      // this could result in an out of
        // bounds exception if this check were not done
        index %= 4;
    }
    if (index == 3) {
        decltype(index) exp = 4;

        while (exp > 3) {  // doing a lock free modulus we need to make sure the nextAirLock<4
            if (nextAirLock.compare_exchange_weak(exp, exp % 4)) {
                break;
            }
        }
    }
    return index;
}